

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IndexSpaceI.H
# Opt level: O1

void __thiscall
amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>::IndexSpaceImp
          (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_> *this,
          GeometryShop<amrex::EB2::CylinderIF,_int> *gshop,Geometry *geom,
          int required_coarsening_level,int max_coarsening_level,int ngrow,
          bool build_coarse_level_by_coarsening,bool extend_domain_face,int num_coarsen_opt)

{
  Vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>_>_>
  *this_00;
  pointer *ppGVar1;
  pointer *ppBVar2;
  Real *pRVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  pointer pGVar7;
  pointer pGVar8;
  Real RVar9;
  Real RVar10;
  Real RVar11;
  Real RVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  long lVar16;
  long lVar17;
  undefined4 uVar18;
  bool bVar19;
  int iVar20;
  long *plVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  Real *pRVar25;
  size_type *psVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  Level *this_01;
  uint uVar31;
  bool extend_domain_face_local;
  uint local_198;
  int ng;
  int local_190;
  int local_18c;
  Box cdomain;
  string __str;
  long *local_118 [2];
  long local_108 [2];
  Geometry cgeom;
  
  extend_domain_face_local = extend_domain_face;
  (this->super_IndexSpace)._vptr_IndexSpace = (_func_int **)&PTR__IndexSpaceImp_008381d8;
  RVar9 = (gshop->m_f).m_height;
  iVar27 = (gshop->m_f).m_direction;
  uVar18 = *(undefined4 *)&(gshop->m_f).field_0x14;
  RVar10 = (gshop->m_f).m_center.x;
  RVar11 = (gshop->m_f).m_center.y;
  RVar12 = (gshop->m_f).m_center.z;
  (this->m_gshop).m_f.m_radius = (gshop->m_f).m_radius;
  (this->m_gshop).m_f.m_height = RVar9;
  (this->m_gshop).m_f.m_direction = iVar27;
  *(undefined4 *)&(this->m_gshop).m_f.field_0x14 = uVar18;
  (this->m_gshop).m_f.m_center.x = RVar10;
  (this->m_gshop).m_f.m_center.y = RVar11;
  (this->m_gshop).m_f.m_center.z = RVar12;
  (this->m_gshop).m_f.m_sign = (gshop->m_f).m_sign;
  (this->m_gshop).m_resource = gshop->m_resource;
  this->m_build_coarse_level_by_coarsening = build_coarse_level_by_coarsening;
  this->m_extend_domain_face = extend_domain_face;
  this->m_num_coarsen_opt = num_coarsen_opt;
  this_00 = &this->m_gslevel;
  (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_gslevel).
  super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>_>_>
  .
  super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_gslevel).
  super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>_>_>
  .
  super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_gslevel).
  super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>_>_>
  .
  super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18c = required_coarsening_level;
  if (0x1e < (uint)required_coarsening_level) {
    Assert_host("required_coarsening_level >= 0 && required_coarsening_level <= 30",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB2_IndexSpaceI.H"
                ,0xe,(char *)0x0);
  }
  iVar27 = local_18c;
  if (max_coarsening_level < local_18c) {
    max_coarsening_level = local_18c;
  }
  iVar20 = 0x1e;
  if (max_coarsening_level < 0x1e) {
    iVar20 = max_coarsening_level;
  }
  local_190 = 0;
  if (0 < ngrow) {
    local_190 = ngrow;
  }
  iVar22 = local_18c;
  if (0 < local_18c) {
    do {
      local_190 = local_190 * 2;
      iVar22 = iVar22 + -1;
    } while (iVar22 != 0);
  }
  iVar4._M_current =
       (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
      super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
    _M_realloc_insert<amrex::Geometry_const&>
              ((vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)&this->m_geom,iVar4,geom);
  }
  else {
    memcpy(iVar4._M_current,geom,200);
    ppGVar1 = &(this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppGVar1 = *ppGVar1 + 1;
  }
  iVar5._M_current =
       (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar5._M_current ==
      (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
              ((vector<amrex::Box,std::allocator<amrex::Box>> *)&this->m_domain,iVar5,&geom->domain)
    ;
  }
  else {
    uVar13 = *(undefined8 *)(geom->domain).smallend.vect;
    uVar14 = *(undefined8 *)((geom->domain).smallend.vect + 2);
    uVar15 = *(undefined8 *)((geom->domain).bigend.vect + 2);
    *(undefined8 *)((iVar5._M_current)->bigend).vect = *(undefined8 *)(geom->domain).bigend.vect;
    *(undefined8 *)(((iVar5._M_current)->bigend).vect + 2) = uVar15;
    *(undefined8 *)((iVar5._M_current)->smallend).vect = uVar13;
    *(undefined8 *)(((iVar5._M_current)->smallend).vect + 2) = uVar14;
    ppBVar2 = &(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppBVar2 = *ppBVar2 + 1;
  }
  iVar6._M_current =
       (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->m_ngrow,iVar6,&local_190);
  }
  else {
    *iVar6._M_current = local_190;
    (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         iVar6._M_current + 1;
  }
  std::
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>_>_>
  ::reserve(&this_00->
             super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>_>_>
            ,(long)(iVar20 + 1));
  cgeom.super_CoordSys._0_8_ = this;
  std::
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,int>>>>
  ::
  emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,int>>*,amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,int>const&,amrex::Geometry_const&,int&,int&,bool&,int&>
            ((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,int>>>>
              *)this_00,
             (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_> **)&cgeom,gshop,
             geom,&EB2::max_grid_size,&local_190,&extend_domain_face_local,&num_coarsen_opt);
  local_198 = 1;
  if (0 < max_coarsening_level) {
    do {
      cgeom.super_CoordSys.c_sys = SPHERICAL;
      cgeom.super_CoordSys._4_4_ = 2;
      cgeom.super_CoordSys.offset[0] = (Real)CONCAT44(cgeom.super_CoordSys.offset[0]._4_4_,2);
      __str._M_dataplus._M_p = (pointer)0x200000002;
      __str._M_string_length = CONCAT44(__str._M_string_length._4_4_,2);
      bVar19 = Box::coarsenable(&(this->m_geom).
                                 super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1].domain,
                                (IntVect *)&cgeom,(IntVect *)&__str);
      if (!bVar19) {
        if (iVar27 < (int)local_198) {
          return;
        }
        uVar23 = -local_198;
        if (0 < (int)local_198) {
          uVar23 = local_198;
        }
        uVar28 = 1;
        if (9 < uVar23) {
          uVar24 = (ulong)uVar23;
          uVar31 = 4;
          do {
            uVar28 = uVar31;
            uVar29 = (uint)uVar24;
            if (uVar29 < 100) {
              uVar28 = uVar28 - 2;
              goto LAB_0032d088;
            }
            if (uVar29 < 1000) {
              uVar28 = uVar28 - 1;
              goto LAB_0032d088;
            }
            if (uVar29 < 10000) goto LAB_0032d088;
            uVar24 = uVar24 / 10000;
            uVar31 = uVar28 + 4;
          } while (99999 < uVar29);
          uVar28 = uVar28 + 1;
        }
LAB_0032d088:
        uVar31 = local_198 >> 0x1f;
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&__str,(char)uVar28 - (char)((int)local_198 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (__str._M_dataplus._M_p + uVar31,uVar28,uVar23);
        plVar21 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x789705);
        iVar27 = local_18c;
        pRVar3 = cgeom.super_CoordSys.offset + 1;
        pRVar25 = (Real *)(plVar21 + 2);
        if ((Real *)*plVar21 == pRVar25) {
          cgeom.super_CoordSys.offset[1] = *pRVar25;
          cgeom.super_CoordSys.offset[2] = (Real)plVar21[3];
          cgeom.super_CoordSys._0_8_ = pRVar3;
        }
        else {
          cgeom.super_CoordSys.offset[1] = *pRVar25;
          cgeom.super_CoordSys._0_8_ = (Real *)*plVar21;
        }
        cgeom.super_CoordSys.offset[0] = (Real)plVar21[1];
        *plVar21 = (long)pRVar25;
        plVar21[1] = 0;
        *(undefined1 *)(plVar21 + 2) = 0;
        Abort((string *)&cgeom);
        if ((Real *)cgeom.super_CoordSys._0_8_ != pRVar3) {
          operator_delete((void *)cgeom.super_CoordSys._0_8_,
                          (long)cgeom.super_CoordSys.offset[1] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
      }
      ng = 0;
      if ((int)local_198 <= iVar27) {
        ng = (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             [-1] / 2;
      }
      pGVar7 = (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar30 = *(long *)pGVar7[-1].domain.smallend.vect;
      lVar16 = *(long *)(pGVar7[-1].domain.smallend.vect + 2);
      lVar17 = *(long *)pGVar7[-1].domain.bigend.vect;
      uVar13 = *(undefined8 *)(pGVar7[-1].domain.bigend.vect + 2);
      cdomain.bigend.vect[1] = (int)((ulong)lVar17 >> 0x20);
      cdomain.bigend.vect[2] = (int)uVar13;
      cdomain.btype.itype = SUB84(uVar13,4);
      cdomain.smallend.vect[2] = (int)lVar16;
      cdomain.bigend.vect[0] = (int)((ulong)lVar16 >> 0x20);
      __str._M_dataplus._M_p = (pointer)0x200000002;
      __str._M_string_length = CONCAT44(__str._M_string_length._4_4_,2);
      cdomain.smallend.vect[0] = (int)lVar30;
      if (cdomain.smallend.vect[0] < 0) {
        uVar28 = cdomain.smallend.vect[0] + 1;
        uVar23 = -uVar28;
        if (0 < (int)uVar28) {
          uVar23 = uVar28;
        }
        cdomain.smallend.vect[0] = ~(uVar23 >> 1);
      }
      else {
        cdomain.smallend.vect[0] = (uint)cdomain.smallend.vect[0] >> 1;
      }
      cdomain.smallend.vect[1] = (int)((ulong)lVar30 >> 0x20);
      if (lVar30 < 0) {
        uVar28 = cdomain.smallend.vect[1] + 1;
        uVar23 = -uVar28;
        if (0 < (int)uVar28) {
          uVar23 = uVar28;
        }
        cdomain.smallend.vect[1] = ~(uVar23 >> 1);
      }
      else {
        cdomain.smallend.vect[1] = (uint)cdomain.smallend.vect[1] >> 1;
      }
      if (cdomain.smallend.vect[2] < 0) {
        uVar28 = cdomain.smallend.vect[2] + 1;
        uVar23 = -uVar28;
        if (0 < (int)uVar28) {
          uVar23 = uVar28;
        }
        cdomain.smallend.vect[2] = ~(uVar23 >> 1);
      }
      else {
        cdomain.smallend.vect[2] = (uint)cdomain.smallend.vect[2] >> 1;
      }
      cdomain.btype.itype = SUB84(uVar13,4);
      cdomain.bigend.vect[2] = (int)uVar13;
      if (cdomain.btype.itype == 0) {
        if (lVar16 < 0) {
          uVar28 = cdomain.bigend.vect[0] + 1;
          uVar23 = -uVar28;
          if (0 < (int)uVar28) {
            uVar23 = uVar28;
          }
          cdomain.bigend.vect[0] = ~(uVar23 >> 1);
        }
        else {
          cdomain.bigend.vect[0] = (uint)cdomain.bigend.vect[0] >> 1;
        }
        if (lVar17 < 0) {
          uVar28 = cdomain.bigend.vect[1] + 1;
          uVar23 = -uVar28;
          if (0 < (int)uVar28) {
            uVar23 = uVar28;
          }
          cdomain.bigend.vect[1] = ~(uVar23 >> 1);
        }
        else {
          cdomain.bigend.vect[1] = (uint)cdomain.bigend.vect[1] >> 1;
        }
        if (cdomain.bigend.vect[2] < 0) {
          uVar28 = cdomain.bigend.vect[2] + 1;
          uVar23 = -uVar28;
          if (0 < (int)uVar28) {
            uVar23 = uVar28;
          }
          cdomain.bigend.vect[2] = ~(uVar23 >> 1);
        }
        else {
          cdomain.bigend.vect[2] = (uint)cdomain.bigend.vect[2] >> 1;
        }
      }
      else {
        cgeom.super_CoordSys.c_sys = cartesian;
        cgeom.super_CoordSys._4_4_ = 0;
        cgeom.super_CoordSys.offset[0] =
             (Real)((ulong)cgeom.super_CoordSys.offset[0] & 0xffffffff00000000);
        lVar30 = 0;
        do {
          if (((cdomain.btype.itype >> ((uint)lVar30 & 0x1f) & 1) != 0) &&
             (cdomain.bigend.vect[lVar30] % *(int *)((long)&__str._M_dataplus._M_p + lVar30 * 4) !=
              0)) {
            *(undefined4 *)((long)cgeom.super_CoordSys.offset + lVar30 * 4 + -8) = 1;
          }
          lVar30 = lVar30 + 1;
        } while (lVar30 != 3);
        if (lVar16 < 0) {
          uVar28 = cdomain.bigend.vect[0] + 1;
          uVar23 = -uVar28;
          if (0 < (int)uVar28) {
            uVar23 = uVar28;
          }
          uVar23 = ~(uVar23 >> 1);
        }
        else {
          uVar23 = (uint)cdomain.bigend.vect[0] >> 1;
        }
        if (lVar17 < 0) {
          uVar31 = cdomain.bigend.vect[1] + 1;
          uVar28 = -uVar31;
          if (0 < (int)uVar31) {
            uVar28 = uVar31;
          }
          uVar28 = ~(uVar28 >> 1);
        }
        else {
          uVar28 = (uint)cdomain.bigend.vect[1] >> 1;
        }
        if (cdomain.bigend.vect[2] < 0) {
          uVar29 = cdomain.bigend.vect[2] + 1;
          uVar31 = -uVar29;
          if (0 < (int)uVar29) {
            uVar31 = uVar29;
          }
          uVar31 = ~(uVar31 >> 1);
        }
        else {
          uVar31 = (uint)cdomain.bigend.vect[2] >> 1;
        }
        cdomain.bigend.vect[0] = uVar23 + cgeom.super_CoordSys.c_sys;
        cdomain.bigend.vect[1] = uVar28 + cgeom.super_CoordSys._4_4_;
        cdomain.bigend.vect[2] = uVar31 + cgeom.super_CoordSys.offset[0]._0_4_;
      }
      __str._M_dataplus._M_p = (pointer)0x200000002;
      __str._M_string_length = CONCAT44(__str._M_string_length._4_4_,2);
      memcpy(&cgeom,pGVar7 + -1,200);
      Geometry::coarsen(&cgeom,(IntVect *)&__str);
      __str._M_dataplus._M_p = (pointer)this;
      std::
      vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,int>>>>
      ::
      emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,int>>*,int&,int&,int&,amrex::Geometry&,amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,int>>&>
                ((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,int>>>>
                  *)this_00,
                 (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_> **)&__str,
                 (int *)&local_198,&EB2::max_grid_size,&ng,&cgeom,
                 (this->m_gslevel).
                 super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>_>_>
                 .
                 super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)(int)local_198 + -1);
      pGVar8 = (this->m_gslevel).
               super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>_>_>
               .
               super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pGVar8[-1].super_Level.m_ok == false) {
        this_01 = &pGVar8[-1].super_Level;
        (this->m_gslevel).
        super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>_>_>
        .
        super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)this_01;
        Level::~Level(this_01);
        if (iVar27 < (int)local_198) {
          return;
        }
        if (build_coarse_level_by_coarsening) {
          uVar23 = -local_198;
          if (0 < (int)local_198) {
            uVar23 = local_198;
          }
          uVar28 = 1;
          if (9 < uVar23) {
            uVar24 = (ulong)uVar23;
            uVar31 = 4;
            do {
              uVar28 = uVar31;
              uVar29 = (uint)uVar24;
              if (uVar29 < 100) {
                uVar28 = uVar28 - 2;
                goto LAB_0032d498;
              }
              if (uVar29 < 1000) {
                uVar28 = uVar28 - 1;
                goto LAB_0032d498;
              }
              if (uVar29 < 10000) goto LAB_0032d498;
              uVar24 = uVar24 / 10000;
              uVar31 = uVar28 + 4;
            } while (99999 < uVar29);
            uVar28 = uVar28 + 1;
          }
LAB_0032d498:
          uVar31 = local_198 >> 0x1f;
          local_118[0] = local_108;
          std::__cxx11::string::_M_construct
                    ((ulong)local_118,(char)uVar28 - (char)((int)local_198 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)uVar31 + (long)local_118[0]),uVar28,uVar23);
          plVar21 = (long *)std::__cxx11::string::replace((ulong)local_118,0,(char *)0x0,0x789738);
          iVar27 = local_18c;
          __str._M_dataplus._M_p = (pointer)&__str.field_2;
          psVar26 = (size_type *)(plVar21 + 2);
          if ((size_type *)*plVar21 == psVar26) {
            __str.field_2._M_allocated_capacity = *psVar26;
            __str.field_2._8_8_ = plVar21[3];
          }
          else {
            __str.field_2._M_allocated_capacity = *psVar26;
            __str._M_dataplus._M_p = (pointer)*plVar21;
          }
          __str._M_string_length = plVar21[1];
          *plVar21 = (long)psVar26;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          Abort(&__str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
          if (local_118[0] != local_108) {
            operator_delete(local_118[0],local_108[0] + 1);
          }
        }
        else {
          local_118[0] = (long *)CONCAT44(local_118[0]._4_4_,num_coarsen_opt - local_198);
          __str._M_dataplus._M_p = (pointer)this;
          std::
          vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,int>>>>
          ::
          emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,int>>*,amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,int>const&,amrex::Geometry&,int&,int&,bool&,int>
                    ((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,int>>>>
                      *)this_00,
                     (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_> **)
                     &__str,gshop,&cgeom,&EB2::max_grid_size,&ng,&extend_domain_face_local,
                     (int *)local_118);
        }
      }
      iVar4._M_current =
           (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
        _M_realloc_insert<amrex::Geometry_const&>
                  ((vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)&this->m_geom,iVar4,
                   &cgeom);
      }
      else {
        memcpy(iVar4._M_current,&cgeom,200);
        ppGVar1 = &(this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppGVar1 = *ppGVar1 + 1;
      }
      iVar5._M_current =
           (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
                  ((vector<amrex::Box,std::allocator<amrex::Box>> *)&this->m_domain,iVar5,&cdomain);
      }
      else {
        *(ulong *)((iVar5._M_current)->bigend).vect =
             CONCAT44(cdomain.bigend.vect[1],cdomain.bigend.vect[0]);
        *(undefined8 *)(((iVar5._M_current)->bigend).vect + 2) = cdomain._20_8_;
        *(undefined8 *)((iVar5._M_current)->smallend).vect = cdomain.smallend.vect._0_8_;
        *(ulong *)(((iVar5._M_current)->smallend).vect + 2) =
             CONCAT44(cdomain.bigend.vect[0],cdomain.smallend.vect[2]);
        ppBVar2 = &(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppBVar2 = *ppBVar2 + 1;
      }
      iVar6._M_current =
           (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->m_ngrow,iVar6,&ng);
      }
      else {
        *iVar6._M_current = ng;
        (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             iVar6._M_current + 1;
      }
      bVar19 = (int)local_198 < iVar20;
      local_198 = local_198 + 1;
    } while (bVar19);
  }
  return;
}

Assistant:

IndexSpaceImp<G>::IndexSpaceImp (const G& gshop, const Geometry& geom,
                                 int required_coarsening_level,
                                 int max_coarsening_level,
                                 int ngrow, bool build_coarse_level_by_coarsening,
                                 bool extend_domain_face, int num_coarsen_opt)
    : m_gshop(gshop),
      m_build_coarse_level_by_coarsening(build_coarse_level_by_coarsening),
      m_extend_domain_face(extend_domain_face),
      m_num_coarsen_opt(num_coarsen_opt)
{
    // build finest level (i.e., level 0) first
    AMREX_ALWAYS_ASSERT(required_coarsening_level >= 0 && required_coarsening_level <= 30);
    max_coarsening_level = std::max(required_coarsening_level,max_coarsening_level);
    max_coarsening_level = std::min(30,max_coarsening_level);

    int ngrow_finest = std::max(ngrow,0);
    for (int i = 1; i <= required_coarsening_level; ++i) {
        ngrow_finest *= 2;
    }

    m_geom.push_back(geom);
    m_domain.push_back(geom.Domain());
    m_ngrow.push_back(ngrow_finest);
    m_gslevel.reserve(max_coarsening_level+1);
    m_gslevel.emplace_back(this, gshop, geom, EB2::max_grid_size, ngrow_finest, extend_domain_face,
                           num_coarsen_opt);

    for (int ilev = 1; ilev <= max_coarsening_level; ++ilev)
    {
        bool coarsenable = m_geom.back().Domain().coarsenable(2,2);
        if (!coarsenable) {
            if (ilev <= required_coarsening_level) {
                amrex::Abort("IndexSpaceImp: domain is not coarsenable at level "+std::to_string(ilev));
            } else {
                break;
            }
        }

        int ng = (ilev > required_coarsening_level) ? 0 : m_ngrow.back()/2;

        Box cdomain = amrex::coarsen(m_geom.back().Domain(),2);
        Geometry cgeom = amrex::coarsen(m_geom.back(),2);
        m_gslevel.emplace_back(this, ilev, EB2::max_grid_size, ng, cgeom, m_gslevel[ilev-1]);
        if (!m_gslevel.back().isOK()) {
            m_gslevel.pop_back();
            if (ilev <= required_coarsening_level) {
                if (build_coarse_level_by_coarsening) {
                    amrex::Abort("Failed to build required coarse EB level "+std::to_string(ilev));
                } else {
                    m_gslevel.emplace_back(this, gshop, cgeom, EB2::max_grid_size, ng, extend_domain_face,
                                           num_coarsen_opt-ilev);
                }
            } else {
                break;
            }
        }
        m_geom.push_back(cgeom);
        m_domain.push_back(cdomain);
        m_ngrow.push_back(ng);
    }
}